

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Distributions.cpp
# Opt level: O2

unique_ptr<std::vector<double,_std::allocator<double>_>,_std::default_delete<std::vector<double,_std::allocator<double>_>_>_>
 __thiscall
Distributions::convolve
          (Distributions *this,vector<double,_std::allocator<double>_> *dist1,
          vector<double,_std::allocator<double>_> *dist2,int offset1,int offset2,int *offset_result)

{
  pointer pdVar1;
  pointer pdVar2;
  int iVar3;
  vector<double,_std::allocator<double>_> *this_00;
  ulong uVar4;
  double *pdVar5;
  long lVar6;
  ulong uVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  int iVar11;
  long lVar12;
  double p;
  vector<double,_std::allocator<double>_> *local_40;
  int *local_38;
  
  this_00 = (vector<double,_std::allocator<double>_> *)operator_new(0x18);
  (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  *(vector<double,_std::allocator<double>_> **)this = this_00;
  *offset_result = offset1 + offset2;
  uVar7 = 0xffffffffffffffff;
  lVar10 = -8;
  lVar12 = 0;
  local_40 = dist1;
  local_38 = offset_result;
  while( true ) {
    pdVar1 = (dist1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar2 = (dist2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    iVar3 = (int)((long)(dist2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_finish - (long)pdVar2 >> 3);
    iVar8 = (int)((long)(dist1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_finish - (long)pdVar1 >> 3);
    if (iVar3 + iVar8 + -2 < lVar12) break;
    p = 0.0;
    iVar8 = iVar8 + -1;
    iVar11 = (int)lVar12;
    if (iVar11 <= iVar8) {
      iVar8 = iVar11;
    }
    lVar6 = (long)(iVar11 - iVar3);
    if ((long)(iVar11 - iVar3) < 0) {
      lVar6 = -1;
    }
    lVar9 = (long)(iVar11 - iVar3);
    if ((long)(iVar11 - iVar3) < 0) {
      lVar9 = -1;
    }
    pdVar5 = (double *)((long)pdVar2 + lVar10 + lVar9 * -8);
    for (; lVar6 < iVar8; lVar6 = lVar6 + 1) {
      p = p + pdVar1[lVar6 + 1] * *pdVar5;
      pdVar5 = pdVar5 + -1;
    }
    uVar4 = (long)(this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start;
    if (((uVar4 != 0) || (p != 0.0)) || (NAN(p))) {
      uVar4 = uVar4 >> 3;
      if (p != 0.0) {
        uVar7 = uVar4;
      }
      if (NAN(p)) {
        uVar7 = uVar4;
      }
      uVar7 = uVar7 & 0xffffffff;
      std::vector<double,_std::allocator<double>_>::push_back(this_00,&p);
      dist1 = local_40;
    }
    else {
      *local_38 = *local_38 + 1;
    }
    lVar12 = lVar12 + 1;
    lVar10 = lVar10 + 8;
  }
  std::vector<double,_std::allocator<double>_>::resize(this_00,(long)((int)uVar7 + 1));
  return (__uniq_ptr_data<std::vector<double,_std::allocator<double>_>,_std::default_delete<std::vector<double,_std::allocator<double>_>_>,_true,_true>
          )(__uniq_ptr_data<std::vector<double,_std::allocator<double>_>,_std::default_delete<std::vector<double,_std::allocator<double>_>_>,_true,_true>
            )this;
}

Assistant:

unique_ptr<vector<double> > Distributions::convolve(const vector<double>& dist1, const vector<double>& dist2, int offset1, int offset2, int* offset_result) {
	unique_ptr<vector<double> > result(new vector<double>());
	*offset_result = offset1 + offset2;
	int rightmost_nonzero = -1;
	for (int n = 0; n <= ((int)(dist1.size()+dist2.size()))-2; ++n) {
		double p = 0.0;
		for (int i = max(0, n-((int)dist2.size())+1); i <= min(n, ((int)dist1.size())-1); ++i) {
			p += dist1[i]*dist2[n-i];
		}
		if ((result->size() == 0) && (p == 0.0)) {
			*offset_result += 1;
			continue;
		}
		if (p != 0.0) {
			rightmost_nonzero = result->size();
		}
		result->push_back(p);
	}
	result->resize(rightmost_nonzero+1);
	return result;
}